

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O3

void __thiscall Assimp::B3DImporter::ReadTRIS(B3DImporter *this,int v0)

{
  __uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_> _Var1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  tuple<aiMesh_*,_std::default_delete<aiMesh>_> tVar7;
  ulong *puVar8;
  aiFace *paVar9;
  uint *puVar10;
  B3DImporter *pBVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  aiFace *paVar16;
  __uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_> local_78;
  undefined1 local_70 [32];
  _Base_ptr local_50;
  
  uVar2 = ReadInt(this);
  uVar14 = 0;
  if ((uVar2 != 0xffffffff) &&
     (((int)uVar2 < 0 ||
      (uVar14 = uVar2,
      (int)((ulong)((long)(this->_materials).
                          super__Vector_base<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->_materials).
                         super__Vector_base<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3) <= (int)uVar2)))) {
    local_50 = (_Base_ptr)&stack0xffffffffffffffc0;
    pBVar11 = (B3DImporter *)&stack0xffffffffffffffb0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xffffffffffffffb0,"Bad material id","");
    Fail(pBVar11,(string *)&stack0xffffffffffffffb0);
  }
  tVar7.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>)operator_new(0x520);
  *(uint *)((long)tVar7.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 4) = 0;
  memset((aiVector3D **)
         ((long)tVar7.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x10),0,0xcc);
  *(aiBone ***)
   ((long)tVar7.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
          super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xe0) = (aiBone **)0x0;
  *(undefined8 *)
   ((long)tVar7.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
          super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xe8) = 0;
  *(char *)((long)tVar7.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xf0) = '\0';
  memset((char *)((long)tVar7.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                        super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xf1),0x1b,0x3ff);
  *(uint *)((long)tVar7.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x4f0) = 0;
  *(aiAnimMesh ***)
   ((long)tVar7.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
          super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x4f8) = (aiAnimMesh **)0x0;
  *(undefined8 *)
   ((long)tVar7.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
          super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x500) = 0;
  *(undefined8 *)
   ((long)tVar7.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
          super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x508) = 0;
  ((aiVector3D *)
  ((long)tVar7.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
         super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x510))->x = 0.0;
  ((aiVector3D *)
  ((long)tVar7.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
         super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x510))->y = 0.0;
  *(float *)((long)tVar7.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                   super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x518) = 0.0;
  memset((aiColor4D **)
         ((long)tVar7.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x30),0,0xa0);
  *(uint *)((long)tVar7.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xe8) = uVar14;
  *(uint *)((long)tVar7.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 8) = 0;
  *(undefined4 *)
   tVar7.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
   super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl = 4;
  uVar14 = (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish[-1] - this->_pos;
  uVar13 = (ulong)uVar14 / 0xc;
  local_78._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl =
       (tuple<aiMesh_*,_std::default_delete<aiMesh>_>)
       (tuple<aiMesh_*,_std::default_delete<aiMesh>_>)
       tVar7.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
       super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl;
  puVar8 = (ulong *)operator_new__(uVar13 * 0x10 + 8);
  *puVar8 = uVar13;
  paVar16 = (aiFace *)(puVar8 + 1);
  if (uVar14 < 0xc) {
    *(aiFace **)
     ((long)tVar7.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
            super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xd0) = paVar16;
  }
  else {
    paVar9 = paVar16;
    do {
      paVar9->mNumIndices = 0;
      paVar9->mIndices = (uint *)0x0;
      paVar9 = paVar9 + 1;
    } while (paVar9 != paVar16 + uVar13);
    *(aiFace **)
     ((long)tVar7.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
            super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xd0) = paVar16;
    if (0xb < uVar14) {
      uVar2 = 1;
      if (1 < uVar14 / 0xc) {
        uVar2 = uVar14 / 0xc;
      }
      do {
        iVar3 = ReadInt(this);
        iVar4 = ReadInt(this);
        iVar5 = ReadInt(this);
        uVar14 = iVar3 + v0;
        if (((((int)uVar14 < 0) ||
             (uVar6 = (int)((ulong)((long)(this->_vertices).
                                          super__Vector_base<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->_vertices).
                                         super__Vector_base<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                      -0x49249249, (int)uVar6 <= (int)uVar14)) ||
            (uVar12 = iVar4 + v0, (int)uVar12 < 0)) ||
           (((uVar6 <= uVar12 || (uVar15 = iVar5 + v0, (int)uVar15 < 0)) || (uVar6 <= uVar15)))) {
          local_70._0_8_ = local_70 + 0x10;
          pBVar11 = (B3DImporter *)local_70;
          std::__cxx11::string::_M_construct<char_const*>((string *)pBVar11,"Bad triangle index","")
          ;
          Fail(pBVar11,(string *)local_70);
        }
        paVar16->mNumIndices = 3;
        puVar10 = (uint *)operator_new__(0xc);
        paVar16->mIndices = puVar10;
        *puVar10 = uVar14;
        puVar10[1] = uVar12;
        puVar10[2] = uVar15;
        *(uint *)((long)local_78._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>
                        .super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 8) =
             *(uint *)((long)local_78._M_t.
                             super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                             super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 8) + 1;
        paVar16 = paVar16 + 1;
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
    }
  }
  std::
  vector<std::unique_ptr<aiMesh,std::default_delete<aiMesh>>,std::allocator<std::unique_ptr<aiMesh,std::default_delete<aiMesh>>>>
  ::emplace_back<std::unique_ptr<aiMesh,std::default_delete<aiMesh>>>
            ((vector<std::unique_ptr<aiMesh,std::default_delete<aiMesh>>,std::allocator<std::unique_ptr<aiMesh,std::default_delete<aiMesh>>>>
              *)&this->_meshes,(unique_ptr<aiMesh,_std::default_delete<aiMesh>_> *)&local_78);
  _Var1._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl =
       local_78._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
       super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl;
  if (local_78._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
      super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>)0x0) {
    aiMesh::~aiMesh((aiMesh *)
                    local_78._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                    super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl);
    operator_delete((void *)_Var1._M_t.
                            super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                            super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

void B3DImporter::ReadTRIS( int v0 ){
    int matid=ReadInt();
    if( matid==-1 ){
        matid=0;
    }else if( matid<0 || matid>=(int)_materials.size() ){
#ifdef DEBUG_B3D
        cout<<"material id="<<matid<<endl;
#endif
        Fail( "Bad material id" );
    }

    std::unique_ptr<aiMesh> mesh(new aiMesh);

    mesh->mMaterialIndex=matid;
    mesh->mNumFaces=0;
    mesh->mPrimitiveTypes=aiPrimitiveType_TRIANGLE;

    int n_tris=ChunkSize()/12;
    aiFace *face=mesh->mFaces=new aiFace[n_tris];

    for( int i=0;i<n_tris;++i ){
        int i0=ReadInt()+v0;
        int i1=ReadInt()+v0;
        int i2=ReadInt()+v0;
        if( i0<0 || i0>=(int)_vertices.size() || i1<0 || i1>=(int)_vertices.size() || i2<0 || i2>=(int)_vertices.size() ){
#ifdef DEBUG_B3D
            cout<<"Bad triangle index: i0="<<i0<<", i1="<<i1<<", i2="<<i2<<endl;
#endif
            Fail( "Bad triangle index" );
            continue;
        }
        face->mNumIndices=3;
        face->mIndices=new unsigned[3];
        face->mIndices[0]=i0;
        face->mIndices[1]=i1;
        face->mIndices[2]=i2;
        ++mesh->mNumFaces;
        ++face;
    }

    _meshes.emplace_back( std::move(mesh) );
}